

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThree.cpp
# Opt level: O1

ChConstraintThree * __thiscall
chrono::ChConstraintThree::operator=(ChConstraintThree *this,ChConstraintThree *other)

{
  if (other != this) {
    ChConstraint::operator=(&this->super_ChConstraint,&other->super_ChConstraint);
    this->variables_a = other->variables_a;
    this->variables_b = other->variables_b;
    this->variables_c = other->variables_c;
  }
  return this;
}

Assistant:

ChConstraintThree& ChConstraintThree::operator=(const ChConstraintThree& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraint::operator=(other);

    this->variables_a = other.variables_a;
    this->variables_b = other.variables_b;
    this->variables_c = other.variables_c;

    return *this;
}